

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O2

void WebPDemuxDelete(WebPDemuxer *dmux)

{
  Frame *pFVar1;
  Chunk *pCVar2;
  Frame *ptr;
  Chunk *ptr_00;
  
  if (dmux != (WebPDemuxer *)0x0) {
    ptr = dmux->frames;
    while (ptr != (Frame *)0x0) {
      pFVar1 = ptr->next;
      WebPSafeFree(ptr);
      ptr = pFVar1;
    }
    ptr_00 = dmux->chunks;
    while (ptr_00 != (Chunk *)0x0) {
      pCVar2 = ptr_00->next;
      WebPSafeFree(ptr_00);
      ptr_00 = pCVar2;
    }
    WebPSafeFree(dmux);
    return;
  }
  return;
}

Assistant:

void WebPDemuxDelete(WebPDemuxer* dmux) {
  Chunk* c;
  Frame* f;
  if (dmux == NULL) return;

  for (f = dmux->frames; f != NULL;) {
    Frame* const cur_frame = f;
    f = f->next;
    WebPSafeFree(cur_frame);
  }
  for (c = dmux->chunks; c != NULL;) {
    Chunk* const cur_chunk = c;
    c = c->next;
    WebPSafeFree(cur_chunk);
  }
  WebPSafeFree(dmux);
}